

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O0

void __thiscall
stateObservation::IndexedMatrixArray::setValue(IndexedMatrixArray *this,Matrix *v,uint k)

{
  bool bVar1;
  Matrix *this_00;
  size_type sVar2;
  uint k_local;
  Matrix *v_local;
  IndexedMatrixArray *this_local;
  
  bVar1 = checkIndex(this,k);
  if (bVar1) {
    this_00 = operator[](this,k);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(this_00,v);
  }
  else {
    checkNext_(this,k);
    sVar2 = std::
            deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::size((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(this + 8));
    if (sVar2 == 0) {
      *(uint *)this = k;
    }
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)(this + 8),v);
  }
  return;
}

Assistant:

void IndexedMatrixArray::setValue(const Matrix& v,unsigned k)
{
    if (checkIndex(k))
    {
        (*this)[k]=v;
    }
    else
    {
        checkNext_(k);
        if (v_.size()==0)
            k_=k;

        v_.push_back(v);
    }
}